

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emithelper.cpp
# Opt level: O3

Error __thiscall
asmjit::BaseEmitHelper::emitArgsAssignment
          (BaseEmitHelper *this,FuncFrame *frame,FuncArgsAssignment *args)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  Error EVar8;
  uint32_t uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint uVar12;
  uint32_t uVar13;
  uint uVar14;
  undefined4 uVar15;
  uint32_t uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  FuncArgsContext *this_00;
  uint uVar20;
  ulong uVar21;
  uint32_t *puVar22;
  ulong uVar23;
  FuncArgsContext *this_01;
  FuncArgsContext *pFVar24;
  ulong uVar25;
  uint uVar26;
  uint regId;
  ulong uVar27;
  uint rType;
  long lStack_400;
  uint32_t local_3e8;
  uint local_3e4;
  long local_3e0;
  BaseReg dstReg;
  uint32_t local_380;
  uint local_37c;
  undefined4 local_378;
  undefined4 local_374;
  uint32_t *local_370;
  RAConstraints constraints;
  FuncArgsContext ctx;
  
  bVar2 = frame->_arch;
  constraints._availableRegs[0] = 0;
  constraints._availableRegs[1] = 0;
  constraints._availableRegs[2] = 0;
  constraints._availableRegs[3] = 0;
  FuncArgsContext::FuncArgsContext(&ctx);
  EVar8 = RAConstraints::init(&constraints,(EVP_PKEY_CTX *)(ulong)bVar2);
  if (EVar8 != 0) {
    return EVar8;
  }
  this_01 = &ctx;
  EVar8 = FuncArgsContext::initWorkData(this_01,frame,args,&constraints);
  if (EVar8 != 0) {
    return EVar8;
  }
  lVar19 = (ulong)(bVar2 & 0x7f) * 0xd4;
  this_00 = (FuncArgsContext *)(_archTraits + lVar19);
  uVar27 = (ulong)ctx._varCount;
  puVar22 = (uint32_t *)(ulong)ctx._saVarId;
  bVar3 = *(byte *)&this_00->_archTraits;
  uVar14 = (uint)bVar3;
  if (frame->_minDynamicAlignment <= frame->_finalStackAlignment) {
    if ((frame->_attributes & 0x10) == 0) {
      if (ctx._saVarId < ctx._varCount) {
        uVar14 = (uint)*(byte *)((long)&ctx._vars[(long)puVar22].cur._data + 2);
      }
      else {
        uVar14 = (uint)frame->_saRegId;
      }
    }
    else {
      uVar14 = (uint)(byte)_archTraits[lVar19 + 1];
    }
  }
  uVar20 = (this->_emitter->_gpRegInfo)._signature;
  local_370 = puVar22;
  if (ctx._stackDstMask != '\0') {
    uVar13 = frame->_dirtyRegs[(ulong)(uVar14 != frame->_spRegId) - 3];
    uVar26 = uVar20 & 0xf8;
    uVar16 = uVar26 + 2;
    for (uVar25 = 0; iVar18 = (int)puVar22, uVar27 != uVar25; uVar25 = uVar25 + 1) {
      uVar12 = ctx._vars[uVar25].out._data;
      if ((uVar12 >> 9 & 1) != 0) {
        uVar10 = ctx._vars[uVar25].cur._data;
        if ((uVar10 & 0x300) == 0) {
LAB_001177fa:
          emitArgsAssignment();
          if (iVar18 - 1U < 2) {
            uVar15 = 0xff;
            uVar14 = 0xffff;
            if (iVar18 == 1) {
              uVar14 = 0xff;
            }
            uVar20 = uVar14 & 0xffffffef;
          }
          else {
            if (iVar18 != 6) {
              return 4;
            }
            uVar15 = 0;
            uVar14 = 0xffffffff;
            uVar20 = 0x7ffbffff;
          }
          *(uint *)&this_01->_archTraits = uVar20;
          *(uint *)((long)&this_01->_archTraits + 4) = uVar14;
          *(undefined4 *)&this_01->_constraints = uVar15;
          *(undefined4 *)((long)&this_01->_constraints + 4) = uVar15;
          return 0;
        }
        dstReg.super_Operand.super_Operand_._signature = 1;
        dstReg.super_Operand.super_Operand_._baseId = 0xff;
        dstReg.super_Operand.super_Operand_._data[0] = 0;
        dstReg.super_Operand.super_Operand_._data[1] = 0;
        local_3e4 = (uint)bVar3;
        if (uVar26 == 0) {
          local_3e4 = ((int)uVar12 >> 0x1f) + (uint)bVar3;
        }
        local_3e0 = (ulong)(uint)((int)uVar12 >> 0xc) << 0x20;
        local_378 = 0;
        if (uVar26 == 0) {
          uVar21 = (long)((int)uVar10 >> 0xc) + CONCAT44(uVar14,uVar13);
          local_37c = (uint)(uVar21 >> 0x20);
        }
        else {
          uVar21 = (ulong)(((int)uVar10 >> 0xc) + uVar13);
          local_37c = uVar14;
        }
        local_374 = (undefined4)uVar21;
        local_3e8 = uVar16;
        local_380 = uVar16;
        if ((uVar10 >> 10 & 1) == 0) {
          if ((uVar10 >> 8 & 1) == 0) goto LAB_00117194;
          uVar9 = ArchTraits::regTypeToGroup((ArchTraits *)this_00,uVar10 >> 0x18);
          uVar12 = ctx._vars[uVar25].cur._data;
          uVar10 = uVar12 >> 0x10;
          uVar11 = ArchTraits::regTypeToSignature((ArchTraits *)this_00,uVar12 >> 0x18);
          dstReg.super_Operand.super_Operand_._0_8_ = CONCAT44(uVar10,uVar11) & 0xffffffffff;
          FuncArgsContext::WorkData::unassign
                    ((WorkData *)&ctx._workData[uVar9]._archRegs,(uint32_t)uVar25,uVar10 & 0xff);
        }
        else {
          if ((uVar10 >> 9 & 1) != 0) {
            return 0x1a;
          }
          local_37c = uVar10 >> 0x10 & 0xff;
LAB_00117194:
          uVar21 = (ulong)uVar12 & 0xff;
          bVar6 = Type::_typeData[((ulong)uVar10 & 0xff) + 0x100];
          if ((byte)Type::_typeData[((ulong)uVar10 & 0xff) + 0x100] <
              (byte)Type::_typeData[uVar21 + 0x100]) {
            bVar6 = Type::_typeData[uVar21 + 0x100];
          }
          if ((byte)(((bVar2 & 1) == 0) * '\x04' + 4U) < bVar6) {
            if (((int)uVar21 - 0x20U < 10) && ((int)((ulong)uVar10 & 0xff) - 0x20U < 10)) {
LAB_001171f5:
              lStack_400 = 0x2c;
              goto LAB_001171f8;
            }
            if (bVar6 < 9) {
              dstReg.super_Operand.super_Operand_._signature =
                   *(uint32_t *)(_archTraits + lVar19 + 0x3c);
              if (dstReg.super_Operand.super_Operand_._signature == 0) {
LAB_001172b6:
                dstReg.super_Operand.super_Operand_._signature =
                     *(uint32_t *)(_archTraits + lVar19 + 0x40);
                if (dstReg.super_Operand.super_Operand_._signature == 0) goto LAB_001172cb;
              }
            }
            else {
              if (bVar6 < 0x11) goto LAB_001172b6;
              if (0x20 < bVar6) {
                lStack_400 = 0x48;
                if (0x40 < bVar6) {
                  return 3;
                }
                goto LAB_001171f8;
              }
LAB_001172cb:
              dstReg.super_Operand.super_Operand_._signature =
                   *(uint32_t *)(_archTraits + lVar19 + 0x44);
              lStack_400 = 0x48;
              if (dstReg.super_Operand.super_Operand_._signature == 0) goto LAB_001171f8;
            }
          }
          else {
            lStack_400 = 0x28;
            if (4 < bVar6) goto LAB_001171f5;
LAB_001171f8:
            dstReg.super_Operand.super_Operand_._signature =
                 *(uint32_t *)(this_00->_workData[0]._reserved + lStack_400 + -0x36);
            if (dstReg.super_Operand.super_Operand_._signature == 0) {
              return 3;
            }
          }
          uVar23 = (ulong)(dstReg.super_Operand.super_Operand_._signature >> 2 & 0x3c0);
          uVar12 = ~*(uint *)(ctx._workData[0]._reserved + (uVar23 - 0xe)) &
                   *(uint *)(ctx._workData[0]._reserved + (uVar23 - 0x16));
          if (uVar12 == 0) {
            return 3;
          }
          dstReg.super_Operand.super_Operand_._baseId = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> dstReg.super_Operand.super_Operand_._baseId & 1) == 0;
                dstReg.super_Operand.super_Operand_._baseId =
                     dstReg.super_Operand.super_Operand_._baseId + 1) {
            }
          }
          EVar8 = (*this->_vptr_BaseEmitHelper[2])(this,&dstReg,uVar21,&local_380);
          if (EVar8 != 0) {
            return EVar8;
          }
        }
        uVar12 = ctx._vars[uVar25].cur._data;
        if ((~uVar12 & 0x500) == 0) {
          FuncArgsContext::WorkData::unassign(ctx._workData,(uint32_t)uVar25,uVar12 >> 0x10 & 0xff);
          uVar12 = (uint)(byte)ctx._vars[uVar25].cur._data;
        }
        puVar22 = &local_3e8;
        this_01 = (FuncArgsContext *)this;
        EVar8 = (**this->_vptr_BaseEmitHelper)(this,puVar22,&dstReg,(ulong)(uVar12 & 0xff),0);
        if (EVar8 != 0) {
          return EVar8;
        }
        pbVar1 = (byte *)((long)&ctx._vars[uVar25].cur._data + 1);
        *pbVar1 = *pbVar1 | 8;
      }
    }
  }
  uVar25 = 0;
  uVar26 = 0;
  bVar5 = false;
  do {
    while (uVar25 == uVar27) {
      if (!bVar5) {
        if (ctx._hasStackSrc != true) {
          return 0;
        }
        if ((frame->_minDynamicAlignment <= frame->_finalStackAlignment) &&
           ((frame->_attributes & 0x10) == 0)) {
          if ((uint)local_370 < ctx._varCount) {
            bVar2 = *(byte *)((long)&ctx._vars[(ulong)local_370 & 0xffffffff].cur._data + 2);
          }
          else {
            bVar2 = frame->_saRegId;
          }
          uVar14 = (uint)bVar2;
        }
        uVar13 = frame->_dirtyRegs[(ulong)(uVar14 != frame->_spRegId) - 3];
        uVar20 = uVar20 & 0xf8;
        uVar26 = 1;
        uVar12 = 0;
        do {
          if (uVar26 <= uVar12) {
            return 0;
          }
          for (uVar25 = 0; iVar18 = (int)puVar22, uVar27 != uVar25; uVar25 = uVar25 + 1) {
            uVar10 = uVar26;
            if ((ctx._vars[uVar25].cur._data & 0xa00) == 0x200) {
              uVar17 = ctx._vars[uVar25].out._data;
              if ((uVar17 >> 8 & 1) == 0) {
                emitArgsAssignment();
                goto LAB_001177fa;
              }
              regId = uVar17 >> 0x10 & 0xff;
              rType = uVar17 >> 0x18;
              puVar22 = (uint32_t *)(ulong)rType;
              this_01 = this_00;
              uVar16 = ArchTraits::regTypeToGroup((ArchTraits *)this_00,rType);
              pFVar24 = (FuncArgsContext *)&ctx._workData[uVar16]._archRegs;
              if ((regId == uVar14) && (uVar16 == 0)) {
                uVar10 = 2;
                if (uVar26 == 1) goto LAB_001177d3;
                FuncArgsContext::WorkData::unassign
                          ((WorkData *)pFVar24,(uint)ctx._workData[uVar16]._physToVarId[uVar14],
                           uVar14);
              }
              uVar16 = ArchTraits::regTypeToSignature((ArchTraits *)this_00,rType);
              dstReg.super_Operand.super_Operand_._0_8_ =
                   CONCAT44(uVar17 >> 0x10,uVar16) & 0xffffffffff;
              dstReg.super_Operand.super_Operand_._data[0] = 0;
              dstReg.super_Operand.super_Operand_._data[1] = 0;
              uVar10 = ctx._vars[uVar25].cur._data;
              iVar18 = (int)uVar10 >> 0xc;
              if (uVar20 == 0) {
                uVar21 = (long)iVar18 + CONCAT44(uVar14,uVar13);
                local_3e4 = (uint)(uVar21 >> 0x20);
              }
              else {
                uVar21 = (ulong)(iVar18 + uVar13);
                local_3e4 = uVar14;
              }
              local_3e0 = uVar21 << 0x20;
              local_3e8 = uVar20 + 2;
              EVar8 = (*this->_vptr_BaseEmitHelper[2])
                                (this,&dstReg,(ulong)(byte)ctx._vars[uVar25].out._data,&local_3e8,
                                 (ulong)(uVar10 & 0xff),0);
              if (EVar8 != 0) {
                return EVar8;
              }
              puVar22 = (uint32_t *)(uVar25 & 0xffffffff);
              FuncArgsContext::WorkData::assign((WorkData *)pFVar24,(uint32_t)uVar25,regId);
              ctx._vars[uVar25].cur._data =
                   (uint)(byte)ctx._vars[uVar25].cur._data + (regId << 0x10 | uVar17 & 0xff000000) +
                   0x900;
              this_01 = pFVar24;
              uVar10 = uVar26;
            }
LAB_001177d3:
            uVar26 = uVar10;
          }
          uVar12 = uVar12 + 1;
        } while( true );
      }
      if ((uVar26 & 5) == 4) {
        return 3;
      }
      uVar26 = (~uVar26 & 1) << 2;
      bVar5 = false;
      uVar25 = 0;
    }
    uVar12 = ctx._vars[uVar25].cur._data;
    puVar22 = (uint32_t *)(ulong)uVar12;
    if ((uVar12 & 0x900) == 0x100) {
      uVar13 = ArchTraits::regTypeToGroup((ArchTraits *)this_00,uVar12 >> 0x18);
      uVar16 = ArchTraits::regTypeToGroup
                         ((ArchTraits *)this_00,
                          (uint)*(byte *)((long)&ctx._vars[uVar25].out._data + 3));
      if (uVar13 != uVar16) {
        return 0x1a;
      }
      uVar12 = (uint)*(byte *)((long)&ctx._vars[uVar25].cur._data + 2);
      bVar2 = *(byte *)((long)&ctx._vars[uVar25].out._data + 2);
      uVar16 = (uint32_t)bVar2;
      uVar21 = (ulong)uVar13;
      this_01 = (FuncArgsContext *)&ctx._workData[uVar21]._archRegs;
      puVar22 = (uint32_t *)(ulong)(uint)bVar2;
      pFVar24 = this_01;
      bVar7 = FuncArgsContext::WorkData::isAssigned((WorkData *)this_01,(uint)bVar2);
      if (bVar7) {
        bVar3 = ctx._workData[uVar21]._physToVarId[bVar2];
        uVar10 = ctx._vars[bVar3].out._data;
        if ((uVar10 == 0) || (((uVar10 >> 8 & 1) != 0 && ((uVar10 >> 0x10 & 0xff) == uVar12)))) {
          if ((*(byte *)(lVar19 + 0x135010 + uVar21) & 1) == 0) {
            uVar10 = ~ctx._workData[uVar21]._assignedRegs & ctx._workData[uVar21]._workRegs;
            if (uVar10 != 0) {
              uVar17 = ~ctx._workData[uVar21]._dstRegs & uVar10;
              if (uVar17 == 0) {
                uVar17 = uVar10;
              }
              uVar16 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              goto LAB_00117408;
            }
            bVar5 = true;
            this_01 = pFVar24;
          }
          else {
            bVar4 = *(byte *)((long)&ctx._vars[uVar25].cur._data + 3);
            bVar6 = *(byte *)((long)&ctx._vars[bVar3].cur._data + 3);
            if (bVar4 <= bVar6) {
              bVar4 = bVar6;
            }
            uVar13 = 5;
            if (2 < bVar4 - 2) {
              uVar13 = (uint)bVar4;
            }
            local_3e8 = ArchTraits::regTypeToSignature((ArchTraits *)this_00,uVar13);
            dstReg.super_Operand.super_Operand_._baseId._0_1_ = bVar2;
            dstReg.super_Operand.super_Operand_._signature = local_3e8;
            dstReg.super_Operand.super_Operand_._baseId._1_3_ = 0;
            dstReg.super_Operand.super_Operand_._data[0] = 0;
            dstReg.super_Operand.super_Operand_._data[1] = 0;
            local_3e0 = 0;
            local_3e4 = uVar12;
            EVar8 = (*this->_vptr_BaseEmitHelper[1])(this,&dstReg,&local_3e8,0);
            if (EVar8 != 0) {
              return EVar8;
            }
            puVar22 = (uint32_t *)(uVar25 & 0xffffffff);
            FuncArgsContext::WorkData::swap
                      ((WorkData *)this_01,(uint32_t)uVar25,uVar12,(uint)bVar3,(uint)bVar2);
            ctx._vars[uVar25].cur._data =
                 (ctx._vars[uVar25].cur._data & 0xff00f7ff) + (uint)bVar2 * 0x10000 + 0x800;
            uVar12 = ctx._vars[bVar3].cur._data & 0xff00ffff | uVar12 << 0x10;
            ctx._vars[bVar3].cur._data = uVar12;
            if (ctx._vars[bVar3].out._data != 0) {
              ctx._vars[bVar3].cur._data = uVar12 | 0x800;
            }
            uVar26 = uVar26 | 1;
          }
          goto LAB_001174de;
        }
      }
      else {
LAB_00117408:
        dstReg.super_Operand.super_Operand_._signature =
             ArchTraits::regTypeToSignature
                       ((ArchTraits *)this_00,
                        (uint)*(byte *)((long)&ctx._vars[uVar25].out._data + 3));
        dstReg.super_Operand.super_Operand_._baseId = uVar16;
        dstReg.super_Operand.super_Operand_._data[0] = 0;
        dstReg.super_Operand.super_Operand_._data[1] = 0;
        uVar13 = ctx._vars[uVar25].out._data;
        local_3e8 = ArchTraits::regTypeToSignature
                              ((ArchTraits *)this_00,
                               (uint)*(byte *)((long)&ctx._vars[uVar25].cur._data + 3));
        local_3e0 = 0;
        local_3e4 = uVar12;
        EVar8 = (*this->_vptr_BaseEmitHelper[2])
                          (this,&dstReg,(ulong)(byte)uVar13,&local_3e8,
                           (ulong)(byte)ctx._vars[uVar25].cur._data,0);
        if (EVar8 != 0) {
          return EVar8;
        }
        puVar22 = (uint32_t *)(uVar25 & 0xffffffff);
        FuncArgsContext::WorkData::reassign((WorkData *)this_01,(uint32_t)uVar25,uVar16,uVar12);
        uVar12 = ctx._vars[uVar25].out._data;
        ctx._vars[uVar25].cur._data =
             (uint)(uVar16 == (uVar12 >> 0x10 & 0xff)) * 0x800 +
             (uVar12 & 0xff0000ff | uVar16 << 0x10) + 0x100;
        uVar26 = uVar26 | 3;
        pFVar24 = this_01;
      }
      bVar5 = true;
      this_01 = pFVar24;
    }
LAB_001174de:
    uVar25 = uVar25 + 1;
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SIZE Error BaseEmitHelper::emitArgsAssignment(const FuncFrame& frame, const FuncArgsAssignment& args) {
  typedef FuncArgsContext::Var Var;
  typedef FuncArgsContext::WorkData WorkData;

  enum WorkFlags : uint32_t {
    kWorkNone      = 0x00,
    kWorkDidSome   = 0x01,
    kWorkPending   = 0x02,
    kWorkPostponed = 0x04
  };

  uint32_t arch = frame.arch();
  const ArchTraits& archTraits = ArchTraits::byArch(arch);

  RAConstraints constraints;
  FuncArgsContext ctx;

  ASMJIT_PROPAGATE(constraints.init(arch));
  ASMJIT_PROPAGATE(ctx.initWorkData(frame, args, &constraints));

#ifdef ASMJIT_DUMP_ARGS_ASSIGNMENT
  {
    String sb;
    dumpAssignment(sb, ctx);
    printf("%s\n", sb.data());
  }
#endif

  uint32_t varCount = ctx._varCount;
  WorkData* workData = ctx._workData;

  uint32_t saVarId = ctx._saVarId;
  BaseReg sp = BaseReg::fromSignatureAndId(_emitter->_gpRegInfo.signature(), archTraits.spRegId());
  BaseReg sa = sp;

  if (frame.hasDynamicAlignment()) {
    if (frame.hasPreservedFP())
      sa.setId(archTraits.fpRegId());
    else
      sa.setId(saVarId < varCount ? ctx._vars[saVarId].cur.regId() : frame.saRegId());
  }

  // --------------------------------------------------------------------------
  // Register to stack and stack to stack moves must be first as now we have
  // the biggest chance of having as many as possible unassigned registers.
  // --------------------------------------------------------------------------

  if (ctx._stackDstMask) {
    // Base address of all arguments passed by stack.
    BaseMem baseArgPtr(sa, int32_t(frame.saOffset(sa.id())));
    BaseMem baseStackPtr(sp, 0);

    for (uint32_t varId = 0; varId < varCount; varId++) {
      Var& var = ctx._vars[varId];

      if (!var.out.isStack())
        continue;

      FuncValue& cur = var.cur;
      FuncValue& out = var.out;

      ASMJIT_ASSERT(cur.isReg() || cur.isStack());
      BaseReg reg;

      BaseMem dstStackPtr = baseStackPtr.cloneAdjusted(out.stackOffset());
      BaseMem srcStackPtr = baseArgPtr.cloneAdjusted(cur.stackOffset());

      if (cur.isIndirect()) {
        if (cur.isStack()) {
          // TODO: Indirect stack.
          return DebugUtils::errored(kErrorInvalidAssignment);
        }
        else {
          srcStackPtr.setBaseId(cur.regId());
        }
      }

      if (cur.isReg() && !cur.isIndirect()) {
        WorkData& wd = workData[archTraits.regTypeToGroup(cur.regType())];
        uint32_t rId = cur.regId();

        reg.setSignatureAndId(archTraits.regTypeToSignature(cur.regType()), rId);
        wd.unassign(varId, rId);
      }
      else {
        // Stack to reg move - tricky since we move stack to stack we can decide which
        // register to use. In general we follow the rule that IntToInt moves will use
        // GP regs with possibility to signature or zero extend, and all other moves will
        // either use GP or VEC regs depending on the size of the move.
        RegInfo rInfo = getSuitableRegForMemToMemMove(arch, out.typeId(), cur.typeId());
        if (ASMJIT_UNLIKELY(!rInfo.isValid()))
          return DebugUtils::errored(kErrorInvalidState);

        WorkData& wd = workData[rInfo.group()];
        uint32_t availableRegs = wd.availableRegs();
        if (ASMJIT_UNLIKELY(!availableRegs))
          return DebugUtils::errored(kErrorInvalidState);

        uint32_t rId = Support::ctz(availableRegs);
        reg.setSignatureAndId(rInfo.signature(), rId);

        ASMJIT_PROPAGATE(emitArgMove(reg, out.typeId(), srcStackPtr, cur.typeId()));
      }

      if (cur.isIndirect() && cur.isReg())
        workData[BaseReg::kGroupGp].unassign(varId, cur.regId());

      // Register to stack move.
      ASMJIT_PROPAGATE(emitRegMove(dstStackPtr, reg, cur.typeId()));
      var.markDone();
    }
  }

  // --------------------------------------------------------------------------
  // Shuffle all registers that are currently assigned accordingly to target
  // assignment.
  // --------------------------------------------------------------------------

  uint32_t workFlags = kWorkNone;
  for (;;) {
    for (uint32_t varId = 0; varId < varCount; varId++) {
      Var& var = ctx._vars[varId];
      if (var.isDone() || !var.cur.isReg())
        continue;

      FuncValue& cur = var.cur;
      FuncValue& out = var.out;

      uint32_t curGroup = archTraits.regTypeToGroup(cur.regType());
      uint32_t outGroup = archTraits.regTypeToGroup(out.regType());

      uint32_t curId = cur.regId();
      uint32_t outId = out.regId();

      if (curGroup != outGroup) {
        // TODO: Conversion is not supported.
        return DebugUtils::errored(kErrorInvalidAssignment);
      }
      else {
        WorkData& wd = workData[outGroup];
        if (!wd.isAssigned(outId)) {
EmitMove:
          ASMJIT_PROPAGATE(
            emitArgMove(
              BaseReg::fromSignatureAndId(archTraits.regTypeToSignature(out.regType()), outId), out.typeId(),
              BaseReg::fromSignatureAndId(archTraits.regTypeToSignature(cur.regType()), curId), cur.typeId()));

          wd.reassign(varId, outId, curId);
          cur.initReg(out.regType(), outId, out.typeId());

          if (outId == out.regId())
            var.markDone();
          workFlags |= kWorkDidSome | kWorkPending;
        }
        else {
          uint32_t altId = wd._physToVarId[outId];
          Var& altVar = ctx._vars[altId];

          if (!altVar.out.isInitialized() || (altVar.out.isReg() && altVar.out.regId() == curId)) {
            // Only few architectures provide swap operations, and only for few register groups.
            if (archTraits.hasSwap(curGroup)) {
              uint32_t highestType = Support::max(cur.regType(), altVar.cur.regType());
              if (Support::isBetween<uint32_t>(highestType, BaseReg::kTypeGp8Lo, BaseReg::kTypeGp16))
                highestType = BaseReg::kTypeGp32;

              uint32_t signature = archTraits.regTypeToSignature(highestType);
              ASMJIT_PROPAGATE(
                emitRegSwap(BaseReg::fromSignatureAndId(signature, outId),
                            BaseReg::fromSignatureAndId(signature, curId)));
              wd.swap(varId, curId, altId, outId);
              cur.setRegId(outId);
              var.markDone();
              altVar.cur.setRegId(curId);

              if (altVar.out.isInitialized())
                altVar.markDone();
              workFlags |= kWorkDidSome;
            }
            else {
              // If there is a scratch register it can be used to perform the swap.
              uint32_t availableRegs = wd.availableRegs();
              if (availableRegs) {
                uint32_t inOutRegs = wd.dstRegs();
                if (availableRegs & ~inOutRegs)
                  availableRegs &= ~inOutRegs;
                outId = Support::ctz(availableRegs);
                goto EmitMove;
              }
              else {
                workFlags |= kWorkPending;
              }
            }
          }
          else {
            workFlags |= kWorkPending;
          }
        }
      }
    }

    if (!(workFlags & kWorkPending))
      break;

    // If we did nothing twice it means that something is really broken.
    if ((workFlags & (kWorkDidSome | kWorkPostponed)) == kWorkPostponed)
      return DebugUtils::errored(kErrorInvalidState);

    workFlags = (workFlags & kWorkDidSome) ? kWorkNone : kWorkPostponed;
  }

  // --------------------------------------------------------------------------
  // Load arguments passed by stack into registers. This is pretty simple and
  // it never requires multiple iterations like the previous phase.
  // --------------------------------------------------------------------------

  if (ctx._hasStackSrc) {
    uint32_t iterCount = 1;
    if (frame.hasDynamicAlignment() && !frame.hasPreservedFP())
      sa.setId(saVarId < varCount ? ctx._vars[saVarId].cur.regId() : frame.saRegId());

    // Base address of all arguments passed by stack.
    BaseMem baseArgPtr(sa, int32_t(frame.saOffset(sa.id())));

    for (uint32_t iter = 0; iter < iterCount; iter++) {
      for (uint32_t varId = 0; varId < varCount; varId++) {
        Var& var = ctx._vars[varId];
        if (var.isDone())
          continue;

        if (var.cur.isStack()) {
          ASMJIT_ASSERT(var.out.isReg());

          uint32_t outId = var.out.regId();
          uint32_t outType = var.out.regType();

          uint32_t group = archTraits.regTypeToGroup(outType);
          WorkData& wd = ctx._workData[group];

          if (outId == sa.id() && group == BaseReg::kGroupGp) {
            // This register will be processed last as we still need `saRegId`.
            if (iterCount == 1) {
              iterCount++;
              continue;
            }
            wd.unassign(wd._physToVarId[outId], outId);
          }

          BaseReg dstReg = BaseReg::fromSignatureAndId(archTraits.regTypeToSignature(outType), outId);
          BaseMem srcMem = baseArgPtr.cloneAdjusted(var.cur.stackOffset());

          ASMJIT_PROPAGATE(emitArgMove(
            dstReg, var.out.typeId(),
            srcMem, var.cur.typeId()));

          wd.assign(varId, outId);
          var.cur.initReg(outType, outId, var.cur.typeId(), FuncValue::kFlagIsDone);
        }
      }
    }
  }

  return kErrorOk;
}